

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O1

bool refract(Vec3 *vector,Vec3 *normal,float ni_over_nt,Vec3 *refracted)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float __x;
  float fVar8;
  float fVar9;
  
  fVar2 = vector->e[2] * vector->e[2] + vector->e[0] * vector->e[0] + vector->e[1] * vector->e[1];
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar5 = vector->e[2] / fVar2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)vector->e;
  auVar7._4_4_ = fVar2;
  auVar7._0_4_ = fVar2;
  auVar7._8_4_ = fVar2;
  auVar7._12_4_ = fVar2;
  auVar7 = divps(auVar6,auVar7);
  fVar8 = (float)*(undefined8 *)normal->e;
  fVar9 = (float)((ulong)*(undefined8 *)normal->e >> 0x20);
  fVar2 = normal->e[2];
  fVar4 = fVar5 * fVar2 + auVar7._0_4_ * fVar8 + auVar7._4_4_ * fVar9;
  __x = 1.0 - ni_over_nt * ni_over_nt * (1.0 - fVar4 * fVar4);
  if (0.0 < __x) {
    if (__x < 0.0) {
      fVar3 = sqrtf(__x);
    }
    else {
      fVar3 = SQRT(__x);
    }
    fVar1 = normal->e[2];
    *(ulong *)refracted->e =
         CONCAT44(ni_over_nt * (auVar7._4_4_ - fVar9 * fVar4) -
                  fVar3 * (float)((ulong)*(undefined8 *)normal->e >> 0x20),
                  ni_over_nt * (auVar7._0_4_ - fVar8 * fVar4) -
                  fVar3 * (float)*(undefined8 *)normal->e);
    refracted->e[2] = (fVar5 - fVar2 * fVar4) * ni_over_nt - fVar1 * fVar3;
  }
  return 0.0 < __x;
}

Assistant:

bool
refract(const Vec3& vector, const Vec3& normal, float ni_over_nt, Vec3& refracted)
{
    Vec3  _uv           = unit_vector(vector);
    float _dt           = dot(_uv, normal);
    float _discriminant = 1.0f - ni_over_nt*ni_over_nt*(1.0f-_dt*_dt);

    if (_discriminant > 0.0f) {
        refracted = ni_over_nt*(_uv - normal*_dt) - normal*sqrt(_discriminant);
        return true;
    }
    return false;
}